

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O0

PackageInfo * chatra::emb::io::packageInfo(void)

{
  allocator<chatra::Script> *this;
  initializer_list<chatra::NativeCallHandlerInfo> __l;
  initializer_list<chatra::Script> __l_00;
  undefined *puVar1;
  PackageInfo *in_RDI;
  NativeCallHandlerInfo *local_ce0;
  Script *local_b78;
  shared_ptr<chatra::emb::io::IoPackageInterface> local_b30;
  allocator<chatra::NativeCallHandlerInfo> local_b1b;
  undefined1 local_b1a;
  allocator local_b19;
  string local_b18;
  allocator local_af1;
  string local_af0;
  allocator local_ac9;
  string local_ac8;
  allocator local_aa1;
  string local_aa0;
  allocator local_a79;
  string local_a78;
  allocator local_a51;
  string local_a50;
  allocator local_a29;
  string local_a28;
  allocator local_a01;
  string local_a00;
  allocator local_9d9;
  string local_9d8;
  allocator local_9b1;
  string local_9b0;
  allocator local_989;
  string local_988;
  allocator local_961;
  string local_960;
  allocator local_939;
  string local_938;
  allocator local_911;
  string local_910;
  allocator local_8e9;
  string local_8e8;
  allocator local_8c1;
  string local_8c0;
  allocator local_899;
  string local_898;
  allocator local_871;
  string local_870;
  allocator local_849;
  string local_848;
  allocator local_821;
  string local_820;
  allocator local_7f9;
  string local_7f8;
  allocator local_7d1;
  string local_7d0;
  allocator local_7a9;
  string local_7a8;
  allocator local_781;
  string local_780;
  allocator local_759;
  string local_758;
  allocator local_731;
  string local_730;
  allocator local_709;
  string local_708;
  allocator local_6e1;
  string local_6e0;
  NativeCallHandlerInfo *local_6c0;
  NativeCallHandlerInfo local_6b8;
  NativeCallHandlerInfo local_650;
  NativeCallHandlerInfo local_5e8;
  NativeCallHandlerInfo local_580;
  NativeCallHandlerInfo local_518;
  NativeCallHandlerInfo local_4b0;
  NativeCallHandlerInfo local_448;
  NativeCallHandlerInfo local_3e0;
  NativeCallHandlerInfo local_378;
  NativeCallHandlerInfo local_310;
  NativeCallHandlerInfo local_2a8;
  NativeCallHandlerInfo local_240;
  NativeCallHandlerInfo local_1d8;
  NativeCallHandlerInfo local_170;
  undefined1 local_108 [24];
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  string local_d8;
  allocator local_a1;
  string local_a0;
  Script *local_80;
  Script local_78;
  Script *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"io",&local_a1);
  puVar1 = script;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,puVar1,
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Script::Script(&local_78,&local_a0,&local_d8);
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_30 = 1;
  this = (allocator<chatra::Script> *)
         ((long)&handlers.
                 super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  local_38 = &local_78;
  std::allocator<chatra::Script>::allocator(this);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28,__l_00,this);
  std::allocator<chatra::Script>::~allocator
            ((allocator<chatra::Script> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_b78 = (Script *)&local_38;
  do {
    local_b78 = local_b78 + -1;
    Script::~Script(local_b78);
  } while (local_b78 != &local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_b1a = 1;
  local_6c0 = &local_6b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e0,"FileInputStream",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_708,"_init_instance",&local_709);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_6b8,fileInputStream_initInstance,&local_6e0,&local_708);
  local_6c0 = &local_650;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_730,"FileInputStream",&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_758,"close",&local_759);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_650,fileInputStream_close,&local_730,&local_758);
  local_6c0 = &local_5e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,"FileInputStream",&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a8,"available",&local_7a9);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_5e8,fileInputStream_available,&local_780,&local_7a8);
  local_6c0 = &local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7d0,"FileInputStream",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7f8,"_native_read",&local_7f9);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_580,fileInputStream_read,&local_7d0,&local_7f8);
  local_6c0 = &local_518;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_820,"FileInputStream",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_848,"_native_seek",&local_849);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_518,fileInputStream_seek,&local_820,&local_848);
  local_6c0 = &local_4b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_870,"FileInputStream",&local_871);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_898,"position",&local_899);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_4b0,fileInputStream_position,&local_870,&local_898);
  local_6c0 = &local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c0,"FileOutputStream",&local_8c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e8,"_init_instance",&local_8e9);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_448,fileOutputStream_initInstance,&local_8c0,&local_8e8);
  local_6c0 = &local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_910,"FileOutputStream",&local_911);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_938,"close",&local_939);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_3e0,fileOutputStream_close,&local_910,&local_938);
  local_6c0 = &local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_960,"FileOutputStream",&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_988,"flush",&local_989);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_378,fileOutputStream_flush,&local_960,&local_988);
  local_6c0 = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9b0,"FileOutputStream",&local_9b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d8,"_native_write",&local_9d9);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_310,fileOutputStream_write,&local_9b0,&local_9d8);
  local_6c0 = &local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a00,"FileOutputStream",&local_a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a28,"_native_seek",&local_a29);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_2a8,fileOutputStream_seek,&local_a00,&local_a28);
  local_6c0 = &local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a50,"FileOutputStream",&local_a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a78,"position",&local_a79);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_240,fileOutputStream_position,&local_a50,&local_a78);
  local_6c0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_aa0,"Reader",&local_aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ac8,"_convertToString",&local_ac9);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_1d8,reader_convertToString,&local_aa0,&local_ac8);
  local_6c0 = &local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_af0,"Writer",&local_af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b18,"_convertToUtf8",&local_b19);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_170,writer_convertToUtf8,&local_af0,&local_b18);
  local_b1a = 0;
  local_108._0_8_ = &local_6b8;
  local_108._8_8_ = 0xe;
  std::allocator<chatra::NativeCallHandlerInfo>::allocator(&local_b1b);
  __l._M_len = local_108._8_8_;
  __l._M_array = (iterator)local_108._0_8_;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10),__l,&local_b1b);
  std::allocator<chatra::NativeCallHandlerInfo>::~allocator(&local_b1b);
  local_ce0 = (NativeCallHandlerInfo *)local_108;
  do {
    local_ce0 = local_ce0 + -1;
    NativeCallHandlerInfo::~NativeCallHandlerInfo(local_ce0);
  } while (local_ce0 != &local_6b8);
  std::__cxx11::string::~string((string *)&local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::__cxx11::string::~string((string *)&local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  std::__cxx11::string::~string((string *)&local_a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  std::__cxx11::string::~string((string *)&local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10));
  std::make_shared<chatra::emb::io::IoPackageInterface>();
  std::shared_ptr<chatra::IPackage>::shared_ptr<chatra::emb::io::IoPackageInterface,void>
            (&in_RDI->interface,&local_b30);
  std::shared_ptr<chatra::emb::io::IoPackageInterface>::~shared_ptr(&local_b30);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          (local_108 + 0x10));
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"io", script}};
	std::vector<HandlerInfo> handlers = {
			{fileInputStream_initInstance, "FileInputStream", "_init_instance"},
			{fileInputStream_close, "FileInputStream", "close"},
			{fileInputStream_available, "FileInputStream", "available"},
			{fileInputStream_read, "FileInputStream", "_native_read"},
			{fileInputStream_seek, "FileInputStream", "_native_seek"},
			{fileInputStream_position, "FileInputStream", "position"},
			{fileOutputStream_initInstance, "FileOutputStream", "_init_instance"},
			{fileOutputStream_close, "FileOutputStream", "close"},
			{fileOutputStream_flush, "FileOutputStream", "flush"},
			{fileOutputStream_write, "FileOutputStream", "_native_write"},
			{fileOutputStream_seek, "FileOutputStream", "_native_seek"},
			{fileOutputStream_position, "FileOutputStream", "position"},
			{reader_convertToString, "Reader", "_convertToString"},
			{writer_convertToUtf8, "Writer", "_convertToUtf8"},
	};
	return {scripts, handlers, std::make_shared<IoPackageInterface>()};
}